

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O3

vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *
makeSample(vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *__return_storage_ptr__,
          u8 *sampleBuf,u8 **strIn,size_t *lenIn,size_t nlines,
          unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *sample_len_out)

{
  pointer *pppuVar1;
  iterator iVar2;
  vector<unsigned_long,std::allocator<unsigned_long>> *this;
  iterator __position;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *p_Var3;
  ulong uVar4;
  pointer __p;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t len;
  u8 *local_50;
  unsigned_long local_48;
  __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_40;
  uchar *local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (nlines != 0) {
    uVar4 = 0;
    sVar5 = 0;
    do {
      uVar4 = uVar4 + lenIn[sVar5];
      sVar5 = sVar5 + 1;
    } while (nlines != sVar5);
    local_50 = sampleBuf;
    local_40 = (__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)sample_len_out;
    if (uVar4 < 0x4000) {
      do {
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>
                    ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)__return_storage_ptr__
                     ,iVar2,strIn);
        }
        else {
          *iVar2._M_current = *strIn;
          pppuVar1 = &(__return_storage_ptr__->
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppuVar1 = *pppuVar1 + 1;
        }
        strIn = strIn + 1;
        nlines = nlines - 1;
      } while (nlines != 0);
    }
    else {
      __p = (pointer)operator_new(0x18);
      p_Var3 = local_40;
      (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::reset(local_40,__p);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((p_Var3->_M_t).
                 super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
                 ._M_head_impl,nlines + 0x40);
      local_38 = sampleBuf + 0x4000;
      uVar4 = 0x30f54513209e49;
      do {
        uVar4 = uVar4 * 0xb11924e1 >> 0xf ^ uVar4 * 0xb11924e1;
        uVar6 = uVar4 % nlines;
        sVar5 = lenIn[uVar6];
        while (sVar5 == 0) {
          uVar6 = uVar6 + 1;
          if (uVar6 == nlines) {
            uVar6 = 0;
          }
          sVar5 = lenIn[uVar6];
        }
        uVar4 = uVar4 * 0xb11924e1;
        uVar4 = uVar4 >> 0xf ^ uVar4;
        uVar7 = uVar4 % ((sVar5 - 1 >> 9) + 1);
        local_48 = sVar5 + uVar7 * -0x200;
        if (0x1ff < local_48) {
          local_48 = 0x200;
        }
        switchD_012bc561::default(sampleBuf,strIn[uVar6] + uVar7 * 0x200,local_48);
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>
                    ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)__return_storage_ptr__
                     ,iVar2,&local_50);
        }
        else {
          *iVar2._M_current = local_50;
          pppuVar1 = &(__return_storage_ptr__->
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppuVar1 = *pppuVar1 + 1;
        }
        this = (vector<unsigned_long,std::allocator<unsigned_long>> *)
               (local_40->_M_t).
               super__Tuple_impl<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
               ._M_head_impl;
        __position._M_current = *(unsigned_long **)(this + 8);
        if (__position._M_current == *(unsigned_long **)(this + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(this,__position,&local_48);
        }
        else {
          *__position._M_current = local_48;
          *(unsigned_long **)(this + 8) = __position._M_current + 1;
        }
        sampleBuf = local_50 + local_48;
        local_50 = sampleBuf;
      } while (sampleBuf < local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<u8*> makeSample(u8* sampleBuf, u8* strIn[], size_t *lenIn, size_t nlines,
                                                    unique_ptr<vector<size_t>>& sample_len_out) {
	size_t totSize = 0;
	vector<u8*> sample;

	for(size_t i=0; i<nlines; i++)
		totSize += lenIn[i];
	if (totSize < FSST_SAMPLETARGET) {
		for(size_t i=0; i<nlines; i++)
			sample.push_back(strIn[i]);
	} else {
		size_t sampleRnd = FSST_HASH(4637947);
		u8* sampleLim = sampleBuf + FSST_SAMPLETARGET;

		sample_len_out = unique_ptr<vector<size_t>>(new vector<size_t>());
		sample_len_out->reserve(nlines + FSST_SAMPLEMAXSZ/FSST_SAMPLELINE);

		// This fails if we have a lot of small strings and a few big ones?
		while(sampleBuf < sampleLim) {
			// choose a non-empty line
			sampleRnd = FSST_HASH(sampleRnd);
			size_t linenr = sampleRnd % nlines;
			while (lenIn[linenr] == 0)
				if (++linenr == nlines) linenr = 0;

			// choose a chunk
			size_t chunks = 1 + ((lenIn[linenr]-1) / FSST_SAMPLELINE);
			sampleRnd = FSST_HASH(sampleRnd);
			size_t chunk = FSST_SAMPLELINE*(sampleRnd % chunks);

			// add the chunk to the sample
			size_t len = min(lenIn[linenr]-chunk,FSST_SAMPLELINE);
			memcpy(sampleBuf, strIn[linenr]+chunk, len);
			sample.push_back(sampleBuf);

			sample_len_out->push_back(len);
			sampleBuf += len;
		}
	}
	return sample;
}